

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O3

void Aig_ManVerifyReverseLevel(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int Fill;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigTiming.c"
                  ,0x152,"void Aig_ManVerifyReverseLevel(Aig_Man_t *)");
  }
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar2->pArray[lVar8];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
        if (0xfffffffd < (uVar4 & 7) - 7) {
          if (((ulong)pObj & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
          }
          uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            uVar4 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
          }
          else {
            uVar7 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
            uVar3 = *(uint *)(uVar5 + 0x1c) & 0xffffff;
            if (uVar3 < uVar7) {
              uVar3 = uVar7;
            }
            uVar4 = uVar3 + ((uVar4 & 7) == 6) + 1;
          }
          if (((uint)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x20) & 0xffffff) != uVar4) {
            uVar4 = pObj->Id;
            uVar3 = Aig_ObjReverseLevelNew(p,pObj);
            if (p->vLevelR == (Vec_Int_t *)0x0) {
              __assert_fail("p->vLevelR",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigTiming.c"
                            ,0x30,"int Aig_ObjReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
            }
            Vec_IntFillExtra(p->vLevelR,pObj->Id + 1,Fill);
            iVar1 = pObj->Id;
            if (((long)iVar1 < 0) || (p->vLevelR->nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("Reverse level of node %6d should be %4d instead of %4d.\n",(ulong)uVar4,
                   (ulong)uVar3,(ulong)(uint)p->vLevelR->pArray[iVar1]);
            uVar6 = uVar6 + 1;
            pVVar2 = p->vObjs;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
    if (uVar6 != 0) {
      printf("Reverse levels of %d nodes are incorrect.\n",(ulong)uVar6);
      return;
    }
  }
  return;
}

Assistant:

void Aig_ManVerifyReverseLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->vLevelR );
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjLevel(pObj) != Aig_ObjLevelNew(pObj) )
        {
            printf( "Reverse level of node %6d should be %4d instead of %4d.\n", 
                pObj->Id, Aig_ObjReverseLevelNew(p, pObj), Aig_ObjReverseLevel(p, pObj) );
            Counter++;
        }
    if ( Counter )
    printf( "Reverse levels of %d nodes are incorrect.\n", Counter );
}